

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::FormatCountableNoun_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,int count,char *singular_form,
          char *plural_form)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_40;
  long lStack_38;
  int local_2c [2];
  int count_local;
  
  local_2c[0] = (int)this;
  internal::StreamableToString<int>((string *)local_70,local_2c);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50._M_allocated_capacity = (size_type)&local_40;
  }
  else {
    local_40 = *plVar4;
    local_50._M_allocated_capacity = (size_type)(long *)*plVar2;
  }
  local_50._8_8_ = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append(local_50._M_local_buf);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((long *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40 + 1);
  }
  psVar3 = (string *)(local_70 + 0x10);
  if ((string *)local_70._0_8_ != psVar3) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string FormatCountableNoun(int count,
                                       const char * singular_form,
                                       const char * plural_form) {
  return internal::StreamableToString(count) + " " +
      (count == 1 ? singular_form : plural_form);
}